

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.hpp
# Opt level: O3

void __thiscall ECF::ECF(ECF *this,string *filename,bool auto_split)

{
  allocator<char> local_41;
  string local_40;
  
  (this->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(filename->_M_dataplus)._M_p,&local_41);
  Read(this,&local_40,auto_split);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ECF(const std::string& filename, bool auto_split) { Read(filename.c_str(), auto_split); }